

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O2

int elias_gamma_bits(int value)

{
  int bits;
  int iVar1;
  
  iVar1 = 1;
  for (; 1 < value; value = (uint)value >> 1) {
    iVar1 = iVar1 + 2;
  }
  return iVar1;
}

Assistant:

int elias_gamma_bits(int value) {
    int bits;

    bits = 1;
    while (value > 1) {
        bits += 2;
        value >>= 1;
    }
    return bits;
}